

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<Fad<double>_>::Decompose_Cholesky
          (TPZMatrix<Fad<double>_> *this,list<long,_std::allocator<long>_> *singular)

{
  bool bVar1;
  int iVar2;
  int64_t iVar3;
  int64_t iVar4;
  undefined4 extraout_var;
  TPZBaseMatrix *in_RDI;
  double dVar5;
  Fad<double> tmp2;
  int64_t k_1;
  int64_t j;
  Fad<double> tmp;
  int64_t k;
  int64_t i;
  int64_t dim;
  Fad<double> *in_stack_fffffffffffffc40;
  Fad<double> *in_stack_fffffffffffffc48;
  Fad<double> *in_stack_fffffffffffffc50;
  Fad<double> *in_stack_fffffffffffffc70;
  Fad<double> *pFVar6;
  Fad<double> *in_stack_fffffffffffffc78;
  FadExpr<FadFuncSqrt<Fad<double>_>_> *in_stack_fffffffffffffc88;
  Fad<double> *in_stack_fffffffffffffc90;
  undefined1 local_338 [32];
  undefined1 local_318 [32];
  undefined1 local_2f8 [48];
  undefined1 local_2c8 [64];
  undefined1 local_288 [32];
  undefined1 local_268 [32];
  undefined1 local_248 [48];
  undefined1 local_218 [48];
  undefined1 local_1e8 [32];
  char *in_stack_fffffffffffffe38;
  char *msg2;
  char *in_stack_fffffffffffffe40;
  Fad<double> *pFVar7;
  Fad<double> *pFVar8;
  Fad<double> local_1b8 [2];
  undefined1 local_170 [32];
  undefined8 local_150;
  FadExpr<FadFuncSqrt<Fad<double>_>_> local_148;
  undefined1 local_100 [32];
  undefined1 local_e0 [48];
  undefined1 local_b0 [48];
  undefined1 local_80 [48];
  undefined1 local_50 [32];
  long local_30;
  Fad<double> *local_28;
  long local_20;
  
  if ((in_RDI->fDecomposed != '\0') && (in_RDI->fDecomposed != '\x03')) {
    Error(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  }
  if (in_RDI->fDecomposed == '\0') {
    iVar3 = TPZBaseMatrix::Rows(in_RDI);
    iVar4 = TPZBaseMatrix::Cols(in_RDI);
    if (iVar3 != iVar4) {
      Error(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    }
    iVar2 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0xc])();
    local_20 = CONCAT44(extraout_var,iVar2);
    for (local_28 = (Fad<double> *)0x0; (long)local_28 < local_20;
        local_28 = (Fad<double> *)((long)&local_28->val_ + 1)) {
      for (local_30 = 0; pFVar6 = local_28, local_30 < (long)local_28; local_30 = local_30 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_80,in_RDI,local_28);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_b0,in_RDI,local_28,local_30);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_e0,in_RDI,local_28,local_30);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
        operator-<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
                  (in_stack_fffffffffffffc78,
                   (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffc70);
        Fad<double>::Fad<FadBinaryMinus<Fad<double>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
                  (in_stack_fffffffffffffc90,
                   (FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_fffffffffffffc88);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,pFVar6,pFVar6,local_50);
        Fad<double>::~Fad(in_stack_fffffffffffffc40);
        FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::
        ~FadExpr((FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                  *)in_stack_fffffffffffffc40);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffc40);
        Fad<double>::~Fad(in_stack_fffffffffffffc40);
        Fad<double>::~Fad(in_stack_fffffffffffffc40);
        Fad<double>::~Fad(in_stack_fffffffffffffc40);
      }
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_100,in_RDI,local_28);
      dVar5 = fabs<double>((Fad<double> *)0x133a0dd);
      local_148.fadexpr_.expr_.defaultVal = 1e-12;
      Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffffc50,&in_stack_fffffffffffffc48->val_);
      in_stack_fffffffffffffc90 = (Fad<double> *)fabs<double>((Fad<double> *)0x133a11b);
      Fad<double>::~Fad(in_stack_fffffffffffffc40);
      Fad<double>::~Fad(in_stack_fffffffffffffc40);
      if (dVar5 <= (double)in_stack_fffffffffffffc90) {
        std::__cxx11::list<long,_std::allocator<long>_>::push_back
                  ((list<long,_std::allocator<long>_> *)in_stack_fffffffffffffc50,
                   (value_type_conflict5 *)in_stack_fffffffffffffc48);
        pFVar6 = local_28;
        local_150 = 0x3ff0000000000000;
        in_stack_fffffffffffffc88 = &local_148;
        Fad<double>::Fad<double,_nullptr>
                  (in_stack_fffffffffffffc50,&in_stack_fffffffffffffc48->val_);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (in_RDI,pFVar6,pFVar6,in_stack_fffffffffffffc88);
        Fad<double>::~Fad(in_stack_fffffffffffffc40);
      }
      in_stack_fffffffffffffc78 = local_1b8;
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])
                (in_stack_fffffffffffffc78,in_RDI,local_28);
      sqrt<double>(in_stack_fffffffffffffc78);
      Fad<double>::Fad<FadFuncSqrt<Fad<double>>>
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      FadExpr<FadFuncSqrt<Fad<double>_>_>::~FadExpr
                ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)in_stack_fffffffffffffc40);
      Fad<double>::~Fad(in_stack_fffffffffffffc40);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_28,local_28,local_170);
      pFVar6 = local_28;
      while (pFVar6 = (Fad<double> *)((long)&pFVar6->val_ + 1), (long)pFVar6 < local_20) {
        for (msg2 = (char *)0x0; pFVar8 = local_28, (long)msg2 < (long)local_28; msg2 = msg2 + 1) {
          pFVar7 = pFVar6;
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_218);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_248,in_RDI,local_28,msg2);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_268,in_RDI,msg2,pFVar7);
          operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffffc78,pFVar6);
          operator-<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
                    (in_stack_fffffffffffffc78,
                     (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)pFVar6);
          Fad<double>::
          Fad<FadBinaryMinus<Fad<double>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
                    (in_stack_fffffffffffffc90,
                     (FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                      *)in_stack_fffffffffffffc88);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,pFVar8,pFVar6,local_1e8);
          Fad<double>::~Fad(in_stack_fffffffffffffc40);
          FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
          ::~FadExpr((FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                      *)in_stack_fffffffffffffc40);
          FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                    ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffc40)
          ;
          Fad<double>::~Fad(in_stack_fffffffffffffc40);
          Fad<double>::~Fad(in_stack_fffffffffffffc40);
          Fad<double>::~Fad(in_stack_fffffffffffffc40);
          in_stack_fffffffffffffc70 = pFVar6;
          pFVar6 = pFVar7;
        }
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_288,in_RDI,local_28);
        Fad<double>::Fad(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
        bVar1 = IsZero<Fad<double>>(in_stack_fffffffffffffc40);
        Fad<double>::~Fad(in_stack_fffffffffffffc40);
        if (bVar1) {
          Error((char *)pFVar6,msg2);
        }
        in_stack_fffffffffffffc50 = local_28;
        pFVar8 = pFVar6;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_2f8);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_318,in_RDI,local_28);
        operator/<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
        Fad<double>::Fad<FadBinaryDiv<Fad<double>,Fad<double>>>
                  (in_stack_fffffffffffffc90,
                   (FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffc88);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (in_RDI,in_stack_fffffffffffffc50,pFVar6,local_2c8);
        Fad<double>::~Fad(in_stack_fffffffffffffc40);
        FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffc40);
        Fad<double>::~Fad(in_stack_fffffffffffffc40);
        Fad<double>::~Fad(in_stack_fffffffffffffc40);
        in_stack_fffffffffffffc40 = pFVar8;
        in_stack_fffffffffffffc48 = local_28;
        pFVar6 = in_stack_fffffffffffffc40;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_338);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (in_RDI,in_stack_fffffffffffffc40,in_stack_fffffffffffffc48,local_338);
        Fad<double>::~Fad(in_stack_fffffffffffffc40);
        Fad<double>::~Fad(in_stack_fffffffffffffc40);
      }
      Fad<double>::~Fad(in_stack_fffffffffffffc40);
    }
    in_RDI->fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky(std::list<int64_t> &singular) {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {             //elementos da diagonal
			PutVal( i,i,GetVal(i,i)-GetVal(i,k)*GetVal(i,k) );
		}
		if((fabs(GetVal(i,i))) <= fabs((TVar)1.e-12))
		{
			singular.push_back(i);
			PutVal(i,i,1.);
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {           //elementos fora da diagonal
            for(int64_t k=0; k<i; k++) {
                PutVal( i,j,GetVal(i,j)-GetVal(i,k)*GetVal(k,j) );
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            PutVal(j,i,GetVal(i,j));
			
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
}